

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsimg.cpp
# Opt level: O1

int CTcSymEnumBase::load_from_obj_file(CVmFile *fp,textchar_t *fname,ulong *enum_xlat)

{
  _func_int **pp_Var1;
  char *__s;
  size_t len;
  CVmHashEntry *this;
  char *siz;
  char b [4];
  char buf [32];
  uint local_5c;
  byte local_58 [40];
  
  __s = CTcSymbolBase::base_read_from_sym_file(fp);
  if (__s == (char *)0x0) {
    return 1;
  }
  len = strlen(__s);
  CVmFile::read_bytes(fp,(char *)&local_5c,4);
  CVmFile::read_bytes(fp,(char *)local_58,1);
  siz = __s;
  this = (CVmHashEntry *)CTcPrsSymtab::find(G_prs->global_symtab_,__s,len,(CTcPrsSymtab **)0x0);
  if (this == (CVmHashEntry *)0x0) {
    this = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,(size_t)siz);
    pp_Var1 = (_func_int **)G_prs->next_enum_id_;
    G_prs->next_enum_id_ = (long)pp_Var1 + 1;
    CVmHashEntry::CVmHashEntry(this,__s,len,0);
    *(undefined4 *)&this->field_0x24 = 10;
    this[1]._vptr_CVmHashEntry = pp_Var1;
    *(byte *)&this[1].nxt_ = *(byte *)&this[1].nxt_ & 0xfc | local_58[0] & 1;
    this->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_00320ad8;
    (*G_prs->global_symtab_->_vptr_CTcPrsSymtab[3])(G_prs->global_symtab_,this);
  }
  else if (*(int *)&this->field_0x24 != 10) {
    CTcSymbolBase::log_objfile_conflict((CTcSymbolBase *)this,fname,TC_SYM_ENUM);
    return 0;
  }
  enum_xlat[local_5c] =
       (ulong)(((CTcSymbolBase *)&this[1]._vptr_CVmHashEntry)->super_CVmHashEntryCS).
              super_CVmHashEntry._vptr_CVmHashEntry;
  return 0;
}

Assistant:

int CTcSymEnumBase::load_from_obj_file(class CVmFile *fp,
                                       const textchar_t *fname,
                                       ulong *enum_xlat)
{
    const char *txt;
    size_t len;
    ulong id;
    CTcSymEnum *sym;
    char buf[32];
    int is_token;

    /* read the symbol name information */
    if ((txt = base_read_from_sym_file(fp)) == 0)
        return 1;
    len = strlen(txt);

    /* read our enumerator ID */
    id = fp->read_uint4();

    /* read our flags */
    fp->read_bytes(buf, 1);

    /* get the 'token' flag */
    is_token = ((buf[0] & 1) != 0);

    /* 
     *   If this symbol is already defined, make sure the original
     *   definition is an enum.  If it's not defined, define it anew.  
     */
    sym = (CTcSymEnum *)G_prs->get_global_symtab()->find(txt, len);
    if (sym == 0)
    {
        /* 
         *   It's not defined yet - create the new definition and add it
         *   to the symbol table.  Allocate a new enumerator ID for the
         *   symbol in the normal fashion.  
         */
        sym = new CTcSymEnum(txt, len, FALSE, G_prs->new_enum_id(), is_token);
        G_prs->get_global_symtab()->add_entry(sym);
    }
    else if (sym->get_type() != TC_SYM_ENUM)
    {
        /* 
         *   It's not already defined as an enumerator - log a symbol type
         *   conflict error 
         */
        sym->log_objfile_conflict(fname, TC_SYM_ENUM);

        /* 
         *   proceed despite the error, since this is merely a symbol
         *   conflict and not a file corruption 
         */
        return 0;
    }

    /*
     *   Set the translation table entry for the symbol.  We know the
     *   original ID local to the object file, and we know the new global
     *   enum ID.  
     */
    enum_xlat[id] = sym->get_enum_id();

    /* success */
    return 0;
}